

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::internal::MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>::~MatcherBase
          (MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }